

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<8192,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<160> h;
  keytype k;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  undefined3 uVar5;
  undefined4 in_stack_fffffffffffffbb4;
  byte bVar7;
  undefined4 uVar6;
  Blob<8192> *in_stack_fffffffffffffbb8;
  uint8_t in_stack_fffffffffffffbc7;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  pfHash in_stack_fffffffffffffbd0;
  undefined1 local_428 [211];
  uint8_t in_stack_fffffffffffffcab;
  uint8_t in_stack_fffffffffffffcac;
  uint8_t in_stack_fffffffffffffcad;
  uint8_t in_stack_fffffffffffffcae;
  uint8_t in_stack_fffffffffffffcaf;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_fffffffffffffcb0;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x2000,pcVar4,(ulong)in_ESI);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x16ff3f);
  Blob<8192>::Blob((Blob<8192> *)local_428);
  memset(local_428,0,0x400);
  if ((local_d & 1) != 0) {
    Blob<160>::Blob((Blob<160> *)&stack0xfffffffffffffbb8);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(local_428,0x400,0,&stack0xfffffffffffffbb8);
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back
              ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
               CONCAT44(in_stack_fffffffffffffbb4,in_ESI),(value_type *)CONCAT44(in_EDX,in_ECX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<8192>,Blob<160>>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8,
             (bool)in_stack_fffffffffffffbc7,in_stack_fffffffffffffbb8,
             (vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_ESI));
  sVar3 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  uVar5 = (undefined3)in_stack_fffffffffffffbb4;
  bVar7 = 1;
  bVar1 = TestHashList<Blob<160>>
                    (in_stack_fffffffffffffcb0,(bool)in_stack_fffffffffffffcaf,
                     (bool)in_stack_fffffffffffffcae,(bool)in_stack_fffffffffffffcad,
                     (bool)in_stack_fffffffffffffcac,(bool)in_stack_fffffffffffffcab);
  uVar6 = CONCAT13(bVar1 & bVar7,uVar5);
  printf("\n");
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::~vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)CONCAT44(uVar6,in_ESI));
  return (bool)((byte)((uint)uVar6 >> 0x18) & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}